

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O2

void __thiscall Minisat::Clause::strengthen(Clause *this,Lit p)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = (ulong)this->header >> 0x22;
  for (uVar2 = 0;
      (uVar3 = uVar1, uVar1 != uVar2 &&
      (uVar3 = uVar2, *(int *)(&this[1].header.field_0x0 + uVar2 * 4) != p.x)); uVar2 = uVar2 + 1) {
  }
  for (; (long)uVar3 < (long)(uVar1 - 1); uVar3 = uVar3 + 1) {
    *(undefined4 *)(&this[1].header.field_0x0 + uVar3 * 4) =
         *(undefined4 *)(&this[1].header.field_0x4 + uVar3 * 4);
  }
  pop(this);
  calcAbstraction(this);
  return;
}

Assistant:

inline void Clause::strengthen(Lit p)
{
    remove(*this, p);
    calcAbstraction();
}